

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<unsigned_long,_true> __thiscall
absl::lts_20240722::container_internal::
btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,256,false>>
::
binary_search<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20240722::container_internal::StringBtreeDefaultLess>
          (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,256,false>>
           *this,basic_string_view<char,_std::char_traits<char>_> *k,StringBtreeDefaultLess *comp)

{
  field_type fVar1;
  field_type fVar2;
  SearchResult<unsigned_long,_true> SVar3;
  StringBtreeDefaultLess *comp_local;
  basic_string_view<char,_std::char_traits<char>_> *k_local;
  btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
  *this_local;
  
  fVar1 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
          ::start((btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
                   *)this);
  fVar2 = btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
          ::finish((btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_256,_false>_>
                    *)this);
  SVar3 = binary_search_impl<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20240722::container_internal::StringBtreeDefaultLess>
                    (this,k,fVar1,fVar2,comp);
  return SVar3;
}

Assistant:

SearchResult<size_type, btree_is_key_compare_to<Compare, key_type>::value>
  binary_search(const K &k, const Compare &comp) const {
    return binary_search_impl(k, start(), finish(), comp,
                              btree_is_key_compare_to<Compare, key_type>());
  }